

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O0

void prune_messages(int maxturn)

{
  size_t sVar1;
  size_t sVar2;
  char **local_30;
  char **output;
  int output_count;
  int j;
  char *msg;
  int removed;
  int pos;
  int i;
  int maxturn_local;
  
  if (msghistory != (message *)0x0) {
    msg._0_4_ = 0;
    pos = maxturn;
    while (pos <= msghistory[histpos].turn && (int)msg < histsize) {
      msghistory[histpos].turn = 0;
      if (msghistory[histpos].msg != (char *)0x0) {
        free(msghistory[histpos].msg);
        msghistory[histpos].msg = (char *)0x0;
      }
      msg._0_4_ = (int)msg + 1;
      histpos = histpos + -1;
      if (histpos < 0) {
        histpos = histsize + histpos;
      }
    }
    curline = 0;
    for (removed = 0; removed < 0x28; removed = removed + 1) {
      msglines[removed][0] = '\0';
    }
    for (removed = 0; removed < histsize; removed = removed + 1) {
      msg._4_4_ = histpos + removed + 1;
      if (histsize <= msg._4_4_) {
        msg._4_4_ = msg._4_4_ - histsize;
      }
      _output_count = msghistory[msg._4_4_].msg;
      if (_output_count != (char *)0x0) {
        if (prevturn < msghistory[msg._4_4_].turn) {
          last_redraw_curline = curline;
          start_of_turn_curline = curline;
        }
        prevturn = msghistory[msg._4_4_].turn;
        sVar1 = strlen(msglines[curline]);
        sVar2 = strlen(_output_count);
        if (sVar1 + sVar2 + 2 < 0x50) {
          if (msglines[curline][0] != '\0') {
            strcat(msglines[curline],"  ");
          }
          strcat(msglines[curline],_output_count);
        }
        else {
          ui_wrap_text(0x50,_output_count,(int *)&output,&local_30);
          for (output._4_4_ = 0; output._4_4_ < (int)output; output._4_4_ = output._4_4_ + 1) {
            if (msglines[curline][0] != '\0') {
              newline();
            }
            strcpy(msglines[curline],local_30[output._4_4_]);
          }
          ui_free_wrap(local_30);
        }
      }
    }
  }
  return;
}

Assistant:

static void prune_messages(int maxturn)
{
    int i, pos, removed;
    const char *msg;
    
    if (!msghistory)
	return;
    
    /* remove future messages from the history */
    removed = 0;
    while (msghistory[histpos].turn >= maxturn && removed < histsize) {
	msghistory[histpos].turn = 0;
	if (msghistory[histpos].msg) {
	    free(msghistory[histpos].msg);
	    msghistory[histpos].msg = NULL;
	}
	removed++;
	histpos--;
	if (histpos < 0)
	    histpos += histsize;
    }
    
    /* rebuild msglines */
    curline = 0;
    for (i = 0; i < MAX_MSGLINES; i++)
	msglines[i][0] = '\0';
    for (i = 0; i < histsize; i++) {
	pos = histpos + i + 1;
	if (pos >= histsize)
	    pos -= histsize;
	
	msg = msghistory[pos].msg;
	if (!msg)
	    continue;
	if (msghistory[pos].turn > prevturn)
	    start_of_turn_curline = last_redraw_curline = curline;
	prevturn = msghistory[pos].turn;

	if (strlen(msglines[curline]) + strlen(msg) + 2 < COLNO) {
	    if (msglines[curline][0])
		strcat(msglines[curline], "  ");
	    strcat(msglines[curline], msg);
	} else {
	    int j, output_count;
	    char **output;
	    ui_wrap_text(COLNO, msg, &output_count, &output);
	    for (j = 0; j < output_count; j++) {
		if (msglines[curline][0])
		    newline();
		strcpy(msglines[curline], output[j]);
	    }
	    ui_free_wrap(output);
	}
    }
}